

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void metal_texld(Context *ctx,int texldd)

{
  byte bVar1;
  uint32 uVar2;
  int iVar3;
  RegisterList *item;
  RegisterList *pRVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t len_00;
  byte bVar8;
  size_t in_R8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  RegisterList *item_1;
  char swiz_str [6];
  char swizzle [4];
  undefined4 uStack_234;
  char dst [64];
  char regnum_str [16];
  char proj [64];
  char bias [64];
  char code [128];
  char sampler [64];
  size_t len;
  
  ctx->metal_need_header_texture = 1;
  bVar1 = ctx->major_ver;
  len_00 = (ulong)bVar1 << 0x10;
  bVar8 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar8 = ctx->minor_ver;
  }
  uVar5 = (uint)bVar8 | (uint)bVar1 << 0x10;
  len = (size_t)uVar5;
  if (uVar5 < 0x10004) {
    code[0x70] = '\0';
    code[0x71] = '\0';
    code[0x72] = '\0';
    code[0x73] = '\0';
    code[0x74] = '\0';
    code[0x75] = '\0';
    code[0x76] = '\0';
    code[0x77] = '\0';
    code[0x78] = '\0';
    code[0x79] = '\0';
    code[0x7a] = '\0';
    code[0x7b] = '\0';
    code[0x7c] = '\0';
    code[0x7d] = '\0';
    code[0x7e] = '\0';
    code[0x7f] = '\0';
    code[0x60] = '\0';
    code[0x61] = '\0';
    code[0x62] = '\0';
    code[99] = '\0';
    code[100] = '\0';
    code[0x65] = '\0';
    code[0x66] = '\0';
    code[0x67] = '\0';
    code[0x68] = '\0';
    code[0x69] = '\0';
    code[0x6a] = '\0';
    code[0x6b] = '\0';
    code[0x6c] = '\0';
    code[0x6d] = '\0';
    code[0x6e] = '\0';
    code[0x6f] = '\0';
    code[0x50] = '\0';
    code[0x51] = '\0';
    code[0x52] = '\0';
    code[0x53] = '\0';
    code[0x54] = '\0';
    code[0x55] = '\0';
    code[0x56] = '\0';
    code[0x57] = '\0';
    code[0x58] = '\0';
    code[0x59] = '\0';
    code[0x5a] = '\0';
    code[0x5b] = '\0';
    code[0x5c] = '\0';
    code[0x5d] = '\0';
    code[0x5e] = '\0';
    code[0x5f] = '\0';
    code[0x40] = '\0';
    code[0x41] = '\0';
    code[0x42] = '\0';
    code[0x43] = '\0';
    code[0x44] = '\0';
    code[0x45] = '\0';
    code[0x46] = '\0';
    code[0x47] = '\0';
    code[0x48] = '\0';
    code[0x49] = '\0';
    code[0x4a] = '\0';
    code[0x4b] = '\0';
    code[0x4c] = '\0';
    code[0x4d] = '\0';
    code[0x4e] = '\0';
    code[0x4f] = '\0';
    code[0x30] = '\0';
    code[0x31] = '\0';
    code[0x32] = '\0';
    code[0x33] = '\0';
    code[0x34] = '\0';
    code[0x35] = '\0';
    code[0x36] = '\0';
    code[0x37] = '\0';
    code[0x38] = '\0';
    code[0x39] = '\0';
    code[0x3a] = '\0';
    code[0x3b] = '\0';
    code[0x3c] = '\0';
    code[0x3d] = '\0';
    code[0x3e] = '\0';
    code[0x3f] = '\0';
    code[0x20] = '\0';
    code[0x21] = '\0';
    code[0x22] = '\0';
    code[0x23] = '\0';
    code[0x24] = '\0';
    code[0x25] = '\0';
    code[0x26] = '\0';
    code[0x27] = '\0';
    code[0x28] = '\0';
    code[0x29] = '\0';
    code[0x2a] = '\0';
    code[0x2b] = '\0';
    code[0x2c] = '\0';
    code[0x2d] = '\0';
    code[0x2e] = '\0';
    code[0x2f] = '\0';
    code[0x10] = '\0';
    code[0x11] = '\0';
    code[0x12] = '\0';
    code[0x13] = '\0';
    code[0x14] = '\0';
    code[0x15] = '\0';
    code[0x16] = '\0';
    code[0x17] = '\0';
    code[0x18] = '\0';
    code[0x19] = '\0';
    code[0x1a] = '\0';
    code[0x1b] = '\0';
    code[0x1c] = '\0';
    code[0x1d] = '\0';
    code[0x1e] = '\0';
    code[0x1f] = '\0';
    code[0] = '\0';
    code[1] = '\0';
    code[2] = '\0';
    code[3] = '\0';
    code[4] = '\0';
    code[5] = '\0';
    code[6] = '\0';
    code[7] = '\0';
    code[8] = '\0';
    code[9] = '\0';
    code[10] = '\0';
    code[0xb] = '\0';
    code[0xc] = '\0';
    code[0xd] = '\0';
    code[0xe] = '\0';
    code[0xf] = '\0';
    if (texldd != 0) {
      __assert_fail("!texldd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x164e,"void metal_texld(Context *, const int)");
    }
    pRVar4 = (ctx->samplers).next;
    if (pRVar4 != (RegisterList *)0x0) {
      uVar5 = (ctx->dest_arg).regnum | 0xa0000;
      do {
        uVar7 = pRVar4->regtype << 0x10 | pRVar4->regnum;
        len_00 = (size_t)uVar7;
        if (uVar5 == uVar7) {
          _swizzle = CONCAT44(uStack_234,0x7a7978);
          if (pRVar4->index == 2) {
            _swizzle = CONCAT53(stack0xfffffffffffffdcb,0x7978);
          }
          goto LAB_0011eac6;
        }
      } while ((uVar7 <= uVar5) && (pRVar4 = pRVar4->next, pRVar4 != (RegisterList *)0x0));
    }
    _swizzle = CONCAT44(uStack_234,0x7a7978);
LAB_0011eac6:
    get_METAL_destarg_varname(ctx,dst,len_00);
    snprintf(regnum_str,0x10,"%u",(ulong)(uint)(ctx->dest_arg).regnum);
    snprintf(sampler,0x40,"%s%s","s",regnum_str);
    make_METAL_destarg_assign
              (ctx,code,0x80,"%s_texture.sample(%s, %s.%s)",sampler,sampler,dst,swizzle);
LAB_0011eb63:
    output_line(ctx,"%s",code);
  }
  else {
    if (bVar1 < 2) {
      failf(ctx,"%s","TEXLD == Shader Model 1.4 unimplemented.");
      return;
    }
    pRVar4 = (ctx->samplers).next;
    if (pRVar4 != (RegisterList *)0x0) {
      uVar5 = ctx->source_args[1].regnum | 0xa0000;
      do {
        uVar7 = pRVar4->regtype << 0x10 | pRVar4->regnum;
        len = (size_t)uVar7;
        if (uVar5 == uVar7) goto LAB_0011ebcf;
      } while ((uVar7 <= uVar5) && (pRVar4 = pRVar4->next, pRVar4 != (RegisterList *)0x0));
    }
    pRVar4 = (RegisterList *)0x0;
LAB_0011ebcf:
    dst[0x30] = '\0';
    dst[0x31] = '\0';
    dst[0x32] = '\0';
    dst[0x33] = '\0';
    dst[0x34] = '\0';
    dst[0x35] = '\0';
    dst[0x36] = '\0';
    dst[0x37] = '\0';
    dst[0x38] = '\0';
    dst[0x39] = '\0';
    dst[0x3a] = '\0';
    dst[0x3b] = '\0';
    dst[0x3c] = '\0';
    dst[0x3d] = '\0';
    dst[0x3e] = '\0';
    dst[0x3f] = '\0';
    dst[0x20] = '\0';
    dst[0x21] = '\0';
    dst[0x22] = '\0';
    dst[0x23] = '\0';
    dst[0x24] = '\0';
    dst[0x25] = '\0';
    dst[0x26] = '\0';
    dst[0x27] = '\0';
    dst[0x28] = '\0';
    dst[0x29] = '\0';
    dst[0x2a] = '\0';
    dst[0x2b] = '\0';
    dst[0x2c] = '\0';
    dst[0x2d] = '\0';
    dst[0x2e] = '\0';
    dst[0x2f] = '\0';
    dst[0x10] = '\0';
    dst[0x11] = '\0';
    dst[0x12] = '\0';
    dst[0x13] = '\0';
    dst[0x14] = '\0';
    dst[0x15] = '\0';
    dst[0x16] = '\0';
    dst[0x17] = '\0';
    dst[0x18] = '\0';
    dst[0x19] = '\0';
    dst[0x1a] = '\0';
    dst[0x1b] = '\0';
    dst[0x1c] = '\0';
    dst[0x1d] = '\0';
    dst[0x1e] = '\0';
    dst[0x1f] = '\0';
    dst[0] = '\0';
    dst[1] = '\0';
    dst[2] = '\0';
    dst[3] = '\0';
    dst[4] = '\0';
    dst[5] = '\0';
    dst[6] = '\0';
    dst[7] = '\0';
    dst[8] = '\0';
    dst[9] = '\0';
    dst[10] = '\0';
    dst[0xb] = '\0';
    dst[0xc] = '\0';
    dst[0xd] = '\0';
    dst[0xe] = '\0';
    dst[0xf] = '\0';
    get_METAL_srcarg_varname(ctx,1,sampler,len);
    regnum_str[0] = '\0';
    regnum_str[1] = '\0';
    regnum_str[2] = '\0';
    regnum_str[3] = '\0';
    regnum_str[4] = '\0';
    regnum_str[5] = '\0';
    regnum_str[6] = '\0';
    regnum_str[7] = '\0';
    regnum_str[8] = '\0';
    regnum_str[9] = '\0';
    regnum_str[10] = '\0';
    regnum_str[0xb] = '\0';
    regnum_str[0xc] = '\0';
    regnum_str[0xd] = '\0';
    regnum_str[0xe] = '\0';
    regnum_str[0xf] = '\0';
    _swizzle = 0;
    if (pRVar4 == (RegisterList *)0x0) {
      pcVar9 = "TEXLD using undeclared sampler";
    }
    else {
      pcVar11 = "";
      pcVar9 = "";
      if (texldd != 0) {
        uVar5 = pRVar4->index - 2;
        pcVar9 = "";
        if (uVar5 < 3) {
          iVar6 = *(int *)(&DAT_00126dd8 + (ulong)uVar5 * 4);
          pcVar9 = *(char **)(&DAT_00138db8 + (ulong)uVar5 * 8);
          make_METAL_srcarg_string(ctx,2,iVar6,regnum_str,in_R8);
          make_METAL_srcarg_string(ctx,3,iVar6,swizzle,in_R8);
        }
      }
      bias[0x30] = '\0';
      bias[0x31] = '\0';
      bias[0x32] = '\0';
      bias[0x33] = '\0';
      bias[0x34] = '\0';
      bias[0x35] = '\0';
      bias[0x36] = '\0';
      bias[0x37] = '\0';
      bias[0x38] = '\0';
      bias[0x39] = '\0';
      bias[0x3a] = '\0';
      bias[0x3b] = '\0';
      bias[0x3c] = '\0';
      bias[0x3d] = '\0';
      bias[0x3e] = '\0';
      bias[0x3f] = '\0';
      bias[0x20] = '\0';
      bias[0x21] = '\0';
      bias[0x22] = '\0';
      bias[0x23] = '\0';
      bias[0x24] = '\0';
      bias[0x25] = '\0';
      bias[0x26] = '\0';
      bias[0x27] = '\0';
      bias[0x28] = '\0';
      bias[0x29] = '\0';
      bias[0x2a] = '\0';
      bias[0x2b] = '\0';
      bias[0x2c] = '\0';
      bias[0x2d] = '\0';
      bias[0x2e] = '\0';
      bias[0x2f] = '\0';
      bias[0x10] = '\0';
      bias[0x11] = '\0';
      bias[0x12] = '\0';
      bias[0x13] = '\0';
      bias[0x14] = '\0';
      bias[0x15] = '\0';
      bias[0x16] = '\0';
      bias[0x17] = '\0';
      bias[0x18] = '\0';
      bias[0x19] = '\0';
      bias[0x1a] = '\0';
      bias[0x1b] = '\0';
      bias[0x1c] = '\0';
      bias[0x1d] = '\0';
      bias[0x1e] = '\0';
      bias[0x1f] = '\0';
      bias[0] = '\0';
      bias[1] = '\0';
      bias[2] = '\0';
      bias[3] = '\0';
      bias[4] = '\0';
      bias[5] = '\0';
      bias[6] = '\0';
      bias[7] = '\0';
      bias[8] = '\0';
      bias[9] = '\0';
      bias[10] = '\0';
      bias[0xb] = '\0';
      bias[0xc] = '\0';
      bias[0xd] = '\0';
      bias[0xe] = '\0';
      bias[0xf] = '\0';
      uVar2 = ctx->instruction_controls;
      pcVar12 = "";
      pcVar10 = "";
      if (uVar2 == 2) {
        make_METAL_srcarg_string(ctx,0,8,bias,in_R8);
        uVar2 = ctx->instruction_controls;
        pcVar10 = ")";
        pcVar12 = ", bias(";
      }
      proj[0x30] = '\0';
      proj[0x31] = '\0';
      proj[0x32] = '\0';
      proj[0x33] = '\0';
      proj[0x34] = '\0';
      proj[0x35] = '\0';
      proj[0x36] = '\0';
      proj[0x37] = '\0';
      proj[0x38] = '\0';
      proj[0x39] = '\0';
      proj[0x3a] = '\0';
      proj[0x3b] = '\0';
      proj[0x3c] = '\0';
      proj[0x3d] = '\0';
      proj[0x3e] = '\0';
      proj[0x3f] = '\0';
      proj[0x20] = '\0';
      proj[0x21] = '\0';
      proj[0x22] = '\0';
      proj[0x23] = '\0';
      proj[0x24] = '\0';
      proj[0x25] = '\0';
      proj[0x26] = '\0';
      proj[0x27] = '\0';
      proj[0x28] = '\0';
      proj[0x29] = '\0';
      proj[0x2a] = '\0';
      proj[0x2b] = '\0';
      proj[0x2c] = '\0';
      proj[0x2d] = '\0';
      proj[0x2e] = '\0';
      proj[0x2f] = '\0';
      proj[0x10] = '\0';
      proj[0x11] = '\0';
      proj[0x12] = '\0';
      proj[0x13] = '\0';
      proj[0x14] = '\0';
      proj[0x15] = '\0';
      proj[0x16] = '\0';
      proj[0x17] = '\0';
      proj[0x18] = '\0';
      proj[0x19] = '\0';
      proj[0x1a] = '\0';
      proj[0x1b] = '\0';
      proj[0x1c] = '\0';
      proj[0x1d] = '\0';
      proj[0x1e] = '\0';
      proj[0x1f] = '\0';
      proj[0] = '\0';
      proj[1] = '\0';
      proj[2] = '\0';
      proj[3] = '\0';
      proj[4] = '\0';
      proj[5] = '\0';
      proj[6] = '\0';
      proj[7] = '\0';
      proj[8] = '\0';
      proj[9] = '\0';
      proj[10] = '\0';
      proj[0xb] = '\0';
      proj[0xc] = '\0';
      proj[0xd] = '\0';
      proj[0xe] = '\0';
      proj[0xf] = '\0';
      if (uVar2 == 1) {
        if (pRVar4->index == 3) {
          failf(ctx,"%s","TEXLDP on a cubemap");
        }
        make_METAL_srcarg_string(ctx,0,8,proj,in_R8);
        pcVar11 = " / ";
      }
      uVar5 = pRVar4->index - 2;
      if (uVar5 < 3) {
        make_METAL_srcarg_string(ctx,0,*(int *)(&DAT_00126dd8 + (ulong)uVar5 * 4),dst,in_R8);
        iVar6 = ctx->source_args[1].regnum;
        iVar3 = isscalar(ctx,ctx->shader_type,ctx->source_args[1].regtype,iVar6);
        if (iVar3 != 0) {
          __assert_fail("!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0x16ba,"void metal_texld(Context *, const int)");
        }
        swiz_str[4] = '\0';
        swiz_str[5] = '\0';
        swiz_str[0] = '\0';
        swiz_str[1] = '\0';
        swiz_str[2] = '\0';
        swiz_str[3] = '\0';
        make_METAL_swizzle_string
                  (swiz_str,(ulong)(uint)ctx->source_args[1].swizzle,(ctx->dest_arg).writemask,iVar6
                  );
        if (texldd == 0) {
          make_METAL_destarg_assign
                    (ctx,code,0x80,"%s_texture.sample(%s, %s%s%s%s%s%s)%s",sampler,sampler,dst,
                     pcVar11,proj,pcVar12,bias,pcVar10,swiz_str);
        }
        else {
          make_METAL_destarg_assign
                    (ctx,code,0x80,"%s_texture.sample(%s, %s, gradient%s(%s, %s))%s",sampler,sampler
                     ,dst,pcVar9,regnum_str,swizzle,swiz_str);
        }
        goto LAB_0011eb63;
      }
      pcVar9 = "unknown texture type";
    }
    failf(ctx,"%s",pcVar9);
  }
  return;
}

Assistant:

static void metal_texld(Context *ctx, const int texldd)
{
    ctx->metal_need_header_texture = 1;
    if (!shader_version_atleast(ctx, 1, 4))
    {
        DestArgInfo *info = &ctx->dest_arg;
        char dst[64];
        char sampler[64];
        char code[128] = {0};

        assert(!texldd);

        RegisterList *sreg;
        sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, info->regnum);
        const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

        char swizzle[4] = { 'x', 'y', 'z', '\0' };
        if (ttype == TEXTURE_TYPE_2D)
            swizzle[2] = '\0';  // "xy" instead of "xyz".

        // !!! FIXME: this code counts on the register not having swizzles, etc.
        get_METAL_destarg_varname(ctx, dst, sizeof (dst));
        get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                                 sampler, sizeof (sampler));

        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                  "%s_texture.sample(%s, %s.%s)",
                                  sampler, sampler, dst, swizzle);
        output_line(ctx, "%s", code);
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // else if

    else
    {
        const SourceArgInfo *samp_arg = &ctx->source_args[1];
        RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                          samp_arg->regnum);
        const char *funcname = NULL;
        char src0[64] = { '\0' };
        char src1[64]; get_METAL_srcarg_varname(ctx, 1, src1, sizeof (src1)); // !!! FIXME: SRC_MOD?
        char src2[64] = { '\0' };
        char src3[64] = { '\0' };

        if (sreg == NULL)
        {
            fail(ctx, "TEXLD using undeclared sampler");
            return;
        } // if

        const char *grad = "";
        if (texldd)
        {
            switch ((const TextureType) sreg->index)
            {
                case TEXTURE_TYPE_2D:
                    grad = "2d";
                    make_METAL_srcarg_string_vec2(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec2(ctx, 3, src3, sizeof (src3));
                    break;
                case TEXTURE_TYPE_VOLUME:
                    grad = "3d";
                    make_METAL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
                    break;
                case TEXTURE_TYPE_CUBE:
                    grad = "cube";
                    make_METAL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
                    break;
            } // switch
        } // if

        // !!! FIXME: can TEXLDD set instruction_controls?
        // !!! FIXME: does the d3d bias value map directly to Metal?
        const char *biasleft = "";
        const char *biasright = "";
        char bias[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDB)
        {
            biasleft = ", bias(";
            make_METAL_srcarg_string_w(ctx, 0, bias, sizeof (bias));
            biasright = ")";
        } // if

        // Metal doesn't have a texture2DProj() function, but you just divide
        // your texcoords by texcoords.w to achieve it anyhow, so DIY.
        const char *projop = "";
        char proj[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDP)
        {
            if (sreg->index == TEXTURE_TYPE_CUBE)
                fail(ctx, "TEXLDP on a cubemap");  // !!! FIXME: is this legal?
            projop = " / ";
            make_METAL_srcarg_string_w(ctx, 0, proj, sizeof (proj));
        } // if

        switch ((const TextureType) sreg->index)
        {
            case TEXTURE_TYPE_2D:
                make_METAL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
                break;

            case TEXTURE_TYPE_CUBE:
            case TEXTURE_TYPE_VOLUME:
                make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                break;

            default:
                fail(ctx, "unknown texture type");
                return;
        } // switch

        assert(!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum));
        char swiz_str[6] = { '\0' };
        make_METAL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 samp_arg->swizzle, ctx->dest_arg.writemask);

        char code[128];
        if (texldd)
        {
            make_METAL_destarg_assign(ctx, code, sizeof (code),
                                     "%s_texture.sample(%s, %s, gradient%s(%s, %s))%s",
                                     src1, src1, src0, grad, src2, src3, swiz_str);
        } // if
        else
        {
            make_METAL_destarg_assign(ctx, code, sizeof (code),
                                     "%s_texture.sample(%s, %s%s%s%s%s%s)%s",
                                     src1, src1, src0, projop, proj,
                                     biasleft, bias, biasright, swiz_str);
        } // else

        output_line(ctx, "%s", code);
    } // else
}